

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::UnaryFunctionLayerParams::InternalSwap
          (UnaryFunctionLayerParams *this,UnaryFunctionLayerParams *other)

{
  UnaryFunctionLayerParams *other_local;
  UnaryFunctionLayerParams *this_local;
  
  std::swap<int>(&this->type_,&other->type_);
  std::swap<float>(&this->alpha_,&other->alpha_);
  std::swap<float>(&this->epsilon_,&other->epsilon_);
  std::swap<float>(&this->shift_,&other->shift_);
  std::swap<float>(&this->scale_,&other->scale_);
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void UnaryFunctionLayerParams::InternalSwap(UnaryFunctionLayerParams* other) {
  std::swap(type_, other->type_);
  std::swap(alpha_, other->alpha_);
  std::swap(epsilon_, other->epsilon_);
  std::swap(shift_, other->shift_);
  std::swap(scale_, other->scale_);
  std::swap(_cached_size_, other->_cached_size_);
}